

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

AimTarget * __thiscall aim_t::Result(aim_t *this)

{
  AimTarget *pAVar1;
  
  if ((this->linetarget).super_FTranslatedLineTarget.linetarget != (AActor *)0x0) {
    return &this->linetarget;
  }
  if ((this->thing_other).super_FTranslatedLineTarget.linetarget != (AActor *)0x0) {
    return &this->thing_other;
  }
  pAVar1 = &this->linetarget;
  if ((this->thing_friend).super_FTranslatedLineTarget.linetarget != (AActor *)0x0) {
    pAVar1 = &this->thing_friend;
  }
  return pAVar1;
}

Assistant:

AimTarget *Result()
	{
		AimTarget *result = &linetarget;
		if (result->linetarget == NULL)
		{
			if (thing_other.linetarget != NULL)
			{
				result = &thing_other;
			}
			else if (thing_friend.linetarget != NULL)
			{
				result = &thing_friend;
			}
		}
		return result;
	}